

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void execute_instruction(Emulator *e)

{
  Address AVar1;
  byte bVar2;
  u8 uVar3;
  byte bVar4;
  anon_union_2_2_e984c1e8_for_Registers_5 aVar5;
  u16 uVar6;
  u16 uVar7;
  Bool BVar8;
  bool bVar9;
  anon_union_2_2_e984c1e8_for_Registers_5 local_18;
  u8 cb;
  Bool should_dispatch;
  Address new_pc;
  u16 u16;
  u8 c;
  u8 u;
  s8 s;
  u8 opcode;
  Emulator *e_local;
  
  should_dispatch._3_1_ = FALSE >> 0x18;
  if ((e->state).next_intr_ticks <= (e->state).ticks) {
    if ((e->state).timer.next_intr_ticks <= (e->state).ticks) {
      timer_synchronize(e);
    }
    if ((e->state).serial.next_intr_ticks <= (e->state).ticks) {
      serial_synchronize(e);
    }
    if ((e->state).ppu.next_intr_ticks <= (e->state).ticks) {
      ppu_synchronize(e);
    }
  }
  bVar9 = false;
  if ((e->state).interrupt.state == CPU_STATE_NORMAL) {
    bVar9 = false;
    if ((e->state).interrupt.ime != FALSE) {
      bVar9 = ((e->state).interrupt.new_if & (e->state).interrupt.ie) != 0;
    }
    should_dispatch._3_1_ = read_u8_tick(e,(e->state).reg.PC);
  }
  else {
    switch((e->state).interrupt.state) {
    case CPU_STATE_STOP:
      bVar9 = false;
      if ((e->state).interrupt.ime != FALSE) {
        bVar9 = ((e->state).interrupt.new_if & (e->state).interrupt.ie) != 0;
      }
      if (!bVar9) {
        if ((e->state).cpu_speed.switching == FALSE) {
          (e->state).ticks = (e->state).ticks + 4;
          return;
        }
        intr_synchronize(e);
        (e->state).cpu_speed.switching = FALSE;
        (e->state).cpu_speed.speed = (e->state).cpu_speed.speed ^ SPEED_DOUBLE;
        (e->state).interrupt.state = CPU_STATE_NORMAL;
        if ((e->state).cpu_speed.speed == SPEED_NORMAL) {
          (e->state).cpu_tick = 4;
        }
        else {
          (e->state).cpu_tick = 2;
        }
      }
      should_dispatch._3_1_ = read_u8_tick(e,(e->state).reg.PC);
      break;
    case CPU_STATE_ENABLE_IME:
      bVar9 = false;
      if ((e->state).interrupt.ime != FALSE) {
        bVar9 = ((e->state).interrupt.new_if & (e->state).interrupt.ie) != 0;
      }
      (e->state).interrupt.ime = TRUE;
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      should_dispatch._3_1_ = read_u8_tick(e,(e->state).reg.PC);
      break;
    case CPU_STATE_HALT_BUG:
      bVar9 = false;
      if ((e->state).interrupt.ime != FALSE) {
        bVar9 = ((e->state).interrupt.new_if & (e->state).interrupt.ie) != 0;
      }
      should_dispatch._3_1_ = read_u8(e,(e->state).reg.PC);
      (e->state).reg.PC = (e->state).reg.PC - 1;
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      break;
    case CPU_STATE_HALT:
      bVar4 = (e->state).interrupt.new_if;
      bVar2 = (e->state).interrupt.ie;
      tick(e);
      if ((bVar4 & bVar2) == 0) {
        return;
      }
      intr_synchronize(e);
      dispatch_interrupt(e);
      return;
    case CPU_STATE_HALT_DI:
      bVar4 = (e->state).interrupt.new_if;
      bVar2 = (e->state).interrupt.ie;
      should_dispatch._3_1_ = read_u8_tick(e,(e->state).reg.PC);
      if ((bVar4 & bVar2) == 0) {
        return;
      }
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      bVar9 = false;
    }
  }
  if (bVar9) {
    intr_synchronize(e);
    dispatch_interrupt(e);
  }
  else {
    uVar6 = (e->state).reg.PC;
    local_18.HL = uVar6 + 1;
    (e->state).reg.PC = (u16)local_18;
    switch((long)&switchD_00108d76::switchdataD_00122564 +
           (long)(int)(&switchD_00108d76::switchdataD_00122564)[(byte)should_dispatch._3_1_]) {
    case 0x108d78:
      break;
    case 0x108d7d:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      (e->state).reg.field_1.BC = uVar7;
      local_18.HL = uVar6 + 3;
      break;
    case 0x108daf:
      write_u8_tick(e,(e->state).reg.field_1.BC,(e->state).reg.A);
      break;
    case 0x108dd6:
      (e->state).reg.field_1.BC = (e->state).reg.field_1.BC + 1;
      tick(e);
      break;
    case 0x108dfa:
      bVar4 = (e->state).reg.field_1.field_0.B + 1;
      (e->state).reg.field_1.field_0.B = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x108e64:
      bVar4 = (e->state).reg.field_1.field_0.B - 1;
      (e->state).reg.field_1.field_0.B = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x108ece:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_1.field_0.B = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x108efe:
      bVar4 = (e->state).reg.A;
      BVar8 = (int)(uint)bVar4 >> 7;
      (e->state).reg.F.C = BVar8;
      (e->state).reg.A = bVar4 << 1 | (byte)BVar8;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      break;
    case 0x108f71:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      write_u16_tick(e,uVar7,(e->state).reg.SP);
      local_18.HL = uVar6 + 3;
      break;
    case 0x108fb4:
      tick(e);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xffff < (uint)(e->state).reg.field_3.HL + (uint)(e->state).reg.field_1.BC);
      (e->state).reg.F.H =
           (uint)(0xfff < (ushort)(((e->state).reg.field_3.HL & 0xfff) +
                                  ((e->state).reg.field_1.BC & 0xfff)));
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + (e->state).reg.field_1.BC;
      break;
    case 0x109058:
      uVar3 = read_u8_tick(e,(e->state).reg.field_1.BC);
      (e->state).reg.A = uVar3;
      break;
    case 0x10907d:
      (e->state).reg.field_1.BC = (e->state).reg.field_1.BC - 1;
      tick(e);
      break;
    case 0x1090a1:
      bVar4 = (e->state).reg.field_1.field_0.C + 1;
      (e->state).reg.field_1.field_0.C = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x10910b:
      bVar4 = (e->state).reg.field_1.field_0.C - 1;
      (e->state).reg.field_1.field_0.C = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x109175:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_1.field_0.C = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x1091a5:
      bVar4 = (e->state).reg.A;
      bVar2 = bVar4 & 1;
      (e->state).reg.F.C = (uint)bVar2;
      (e->state).reg.A = bVar2 << 7 | (byte)((int)(uint)bVar4 >> 1);
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      break;
    case 0x109218:
      (e->state).interrupt.state = CPU_STATE_STOP;
      break;
    case 0x10922b:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      (e->state).reg.field_2.DE = uVar7;
      local_18.HL = uVar6 + 3;
      break;
    case 0x10925d:
      write_u8_tick(e,(e->state).reg.field_2.DE,(e->state).reg.A);
      break;
    case 0x109284:
      (e->state).reg.field_2.DE = (e->state).reg.field_2.DE + 1;
      tick(e);
      break;
    case 0x1092a8:
      bVar4 = (e->state).reg.field_2.field_0.D + 1;
      (e->state).reg.field_2.field_0.D = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x109312:
      bVar4 = (e->state).reg.field_2.field_0.D - 1;
      (e->state).reg.field_2.field_0.D = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x10937c:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_2.field_0.D = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x1093ac:
      bVar4 = (e->state).reg.A;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.C = (int)(uint)bVar4 >> 7;
      (e->state).reg.A = bVar4 << 1 | (byte)BVar8;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      break;
    case 0x109423:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      tick(e);
      local_18.HL = uVar6 + 2 + (short)(char)uVar3;
      break;
    case 0x109461:
      tick(e);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xffff < (uint)(e->state).reg.field_3.HL + (uint)(e->state).reg.field_2.DE);
      (e->state).reg.F.H =
           (uint)(0xfff < (ushort)(((e->state).reg.field_3.HL & 0xfff) +
                                  ((e->state).reg.field_2.DE & 0xfff)));
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + (e->state).reg.field_2.DE;
      break;
    case 0x109505:
      uVar3 = read_u8_tick(e,(e->state).reg.field_2.DE);
      (e->state).reg.A = uVar3;
      break;
    case 0x10952a:
      (e->state).reg.field_2.DE = (e->state).reg.field_2.DE - 1;
      tick(e);
      break;
    case 0x10954e:
      bVar4 = (e->state).reg.field_2.field_0.E + 1;
      (e->state).reg.field_2.field_0.E = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x1095b8:
      bVar4 = (e->state).reg.field_2.field_0.E - 1;
      (e->state).reg.field_2.field_0.E = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x109622:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_2.field_0.E = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x109652:
      bVar4 = (e->state).reg.A;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.C = (uint)(bVar4 & 1);
      (e->state).reg.A = (byte)(BVar8 << 7) | (byte)((int)(uint)bVar4 >> 1);
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      break;
    case 0x1096cb:
      local_18.HL = uVar6 + 2;
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      if ((e->state).reg.F.Z == FALSE) {
        local_18.HL = local_18.HL + (short)(char)uVar3;
        tick(e);
      }
      break;
    case 0x109716:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      (e->state).reg.field_3.HL = uVar7;
      local_18.HL = uVar6 + 3;
      break;
    case 0x109748:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.A);
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + 1;
      break;
    case 0x109785:
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + 1;
      tick(e);
      break;
    case 0x1097a9:
      bVar4 = (e->state).reg.field_3.field_0.H + 1;
      (e->state).reg.field_3.field_0.H = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x109813:
      bVar4 = (e->state).reg.field_3.field_0.H - 1;
      (e->state).reg.field_3.field_0.H = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x10987d:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_3.field_0.H = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x1098ad:
      should_dispatch._1_1_ = FALSE >> 8;
      if (((e->state).reg.F.H != FALSE) ||
         (((e->state).reg.F.N == FALSE && (9 < ((e->state).reg.A & 0xf))))) {
        should_dispatch._1_1_ = 6;
      }
      if (((e->state).reg.F.C != FALSE) ||
         (((e->state).reg.F.N == FALSE && (0x99 < (e->state).reg.A)))) {
        should_dispatch._1_1_ = should_dispatch._1_1_ | 0x60;
        (e->state).reg.F.C = TRUE;
      }
      if ((e->state).reg.F.N != FALSE) {
        should_dispatch._1_1_ = -should_dispatch._1_1_;
      }
      (e->state).reg.A = (e->state).reg.A + should_dispatch._1_1_;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = FALSE;
      break;
    case 0x109992:
      local_18.HL = uVar6 + 2;
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      if ((e->state).reg.F.Z != FALSE) {
        local_18.HL = local_18.HL + (short)(char)uVar3;
        tick(e);
      }
      break;
    case 0x1099dd:
      tick(e);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xffff < (uint)(e->state).reg.field_3.HL + (uint)(e->state).reg.field_3.HL);
      (e->state).reg.F.H =
           (uint)(0xfff < (ushort)(((e->state).reg.field_3.HL & 0xfff) +
                                  ((e->state).reg.field_3.HL & 0xfff)));
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + (e->state).reg.field_3.HL;
      break;
    case 0x109a81:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = uVar3;
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + 1;
      break;
    case 0x109abc:
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL - 1;
      tick(e);
      break;
    case 0x109ae0:
      bVar4 = (e->state).reg.field_3.field_0.L + 1;
      (e->state).reg.field_3.field_0.L = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x109b4a:
      bVar4 = (e->state).reg.field_3.field_0.L - 1;
      (e->state).reg.field_3.field_0.L = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x109bb4:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.field_3.field_0.L = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x109be4:
      (e->state).reg.A = (e->state).reg.A ^ 0xff;
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.N = TRUE;
      break;
    case 0x109c1f:
      local_18.HL = uVar6 + 2;
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      if ((e->state).reg.F.C == FALSE) {
        local_18.HL = local_18.HL + (short)(char)uVar3;
        tick(e);
      }
      break;
    case 0x109c6a:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      (e->state).reg.SP = uVar7;
      local_18.HL = uVar6 + 3;
      break;
    case 0x109c9c:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.A);
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL - 1;
      break;
    case 0x109cd9:
      (e->state).reg.SP = (e->state).reg.SP + 1;
      tick(e);
      break;
    case 0x109cfd:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      bVar4 = uVar3 + 1;
      write_u8_tick(e,(e->state).reg.field_3.HL,bVar4);
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x109d7f:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      bVar4 = uVar3 - 1;
      write_u8_tick(e,(e->state).reg.field_3.HL,bVar4);
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x109e01:
      AVar1 = (e->state).reg.field_3.HL;
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      write_u8_tick(e,AVar1,uVar3);
      local_18.HL = uVar6 + 2;
      break;
    case 0x109e4f:
      (e->state).reg.F.C = TRUE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x109e7e:
      local_18.HL = uVar6 + 2;
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      if ((e->state).reg.F.C != FALSE) {
        local_18.HL = local_18.HL + (short)(char)uVar3;
        tick(e);
      }
      break;
    case 0x109ec9:
      tick(e);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xffff < (uint)(e->state).reg.field_3.HL + (uint)(e->state).reg.SP);
      (e->state).reg.F.H =
           (uint)(0xfff < (ushort)(((e->state).reg.field_3.HL & 0xfff) + ((e->state).reg.SP & 0xfff)
                                  ));
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL + (e->state).reg.SP;
      break;
    case 0x109f6d:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = uVar3;
      (e->state).reg.field_3.HL = (e->state).reg.field_3.HL - 1;
      break;
    case 0x109fa8:
      (e->state).reg.SP = (e->state).reg.SP - 1;
      tick(e);
      break;
    case 0x109fcc:
      bVar4 = (e->state).reg.A + 1;
      (e->state).reg.A = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0);
      break;
    case 0x10a036:
      bVar4 = (e->state).reg.A - 1;
      (e->state).reg.A = bVar4;
      (e->state).reg.F.Z = (uint)(bVar4 == 0);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.H = (uint)((bVar4 & 0xf) == 0xf);
      break;
    case 0x10a0a0:
      uVar3 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.A = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x10a0d0:
      (e->state).reg.F.C = (e->state).reg.F.C ^ TRUE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10a104:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a11d:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a136:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a14f:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a168:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a181:
      (e->state).reg.field_1.field_0.B = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a19a:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_1.field_0.B = uVar3;
      break;
    case 0x10a1bf:
      (e->state).reg.field_1.field_0.B = (e->state).reg.A;
      break;
    case 0x10a1d8:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a1f1:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a20a:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a223:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a23c:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a255:
      (e->state).reg.field_1.field_0.C = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a26e:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_1.field_0.C = uVar3;
      break;
    case 0x10a293:
      (e->state).reg.field_1.field_0.C = (e->state).reg.A;
      break;
    case 0x10a2ac:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a2c5:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a2de:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a2f7:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a310:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a329:
      (e->state).reg.field_2.field_0.D = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a342:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_2.field_0.D = uVar3;
      break;
    case 0x10a367:
      (e->state).reg.field_2.field_0.D = (e->state).reg.A;
      break;
    case 0x10a380:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a399:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a3b2:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a3cb:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a3e4:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a3fd:
      (e->state).reg.field_2.field_0.E = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a416:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_2.field_0.E = uVar3;
      break;
    case 0x10a43b:
      (e->state).reg.field_2.field_0.E = (e->state).reg.A;
      break;
    case 0x10a454:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a46d:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a486:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a49f:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a4b8:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a4d1:
      (e->state).reg.field_3.field_0.H = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a4ea:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_3.field_0.H = uVar3;
      break;
    case 0x10a50f:
      (e->state).reg.field_3.field_0.H = (e->state).reg.A;
      break;
    case 0x10a528:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a541:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a55a:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a573:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a58c:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a5a5:
      (e->state).reg.field_3.field_0.L = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a5be:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.field_3.field_0.L = uVar3;
      break;
    case 0x10a5e3:
      (e->state).reg.field_3.field_0.L = (e->state).reg.A;
      break;
    case 0x10a5fc:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_1.field_0.B);
      break;
    case 0x10a623:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_1.field_0.C);
      break;
    case 0x10a64a:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_2.field_0.D);
      break;
    case 0x10a671:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_2.field_0.E);
      break;
    case 0x10a698:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_3.field_0.H);
      break;
    case 0x10a6bf:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.field_3.field_0.L);
      break;
    case 0x10a6e6:
      if ((e->state).interrupt.ime == FALSE) {
        if (((e->state).interrupt.ie & (e->state).interrupt.new_if & 0x1f) == 0) {
          (e->state).interrupt.state = CPU_STATE_HALT_DI;
        }
        else {
          (e->state).interrupt.state = CPU_STATE_HALT_BUG;
        }
      }
      else {
        (e->state).interrupt.state = CPU_STATE_HALT;
      }
      break;
    case 0x10a748:
      write_u8_tick(e,(e->state).reg.field_3.HL,(e->state).reg.A);
      break;
    case 0x10a76f:
      (e->state).reg.A = (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a788:
      (e->state).reg.A = (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a7a1:
      (e->state).reg.A = (e->state).reg.field_2.field_0.D;
      break;
    case 0x10a7ba:
      (e->state).reg.A = (e->state).reg.field_2.field_0.E;
      break;
    case 0x10a7d3:
      (e->state).reg.A = (e->state).reg.field_3.field_0.H;
      break;
    case 0x10a7ec:
      (e->state).reg.A = (e->state).reg.field_3.field_0.L;
      break;
    case 0x10a805:
      uVar3 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = uVar3;
      break;
    case 0x10a82a:
      (e->state).reg.A = (e->state).reg.A;
      break;
    case 0x10a843:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_1.field_0.B) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_1.field_0.B);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_1.field_0.B & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_1.field_0.B;
      break;
    case 0x10a906:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_1.field_0.C) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_1.field_0.C);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_1.field_0.C & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_1.field_0.C;
      break;
    case 0x10a9c9:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_2.field_0.D) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_2.field_0.D);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_2.field_0.D & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_2.field_0.D;
      break;
    case 0x10aa8c:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_2.field_0.E) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_2.field_0.E);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_2.field_0.E & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_2.field_0.E;
      break;
    case 0x10ab4f:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_3.field_0.H) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_3.field_0.H);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_3.field_0.H & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_3.field_0.H;
      break;
    case 0x10ac12:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.field_3.field_0.L) == '\0')
      ;
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C =
           (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.field_3.field_0.L);
      (e->state).reg.F.H =
           (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.field_3.field_0.L & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.field_3.field_0.L;
      break;
    case 0x10acd5:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4);
      (e->state).reg.F.H = (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + (bVar4 & 0xf)));
      (e->state).reg.A = (e->state).reg.A + bVar4;
      break;
    case 0x10ad93:
      (e->state).reg.F.Z = (uint)((u8)((e->state).reg.A + (e->state).reg.A) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)(e->state).reg.A);
      (e->state).reg.F.H = (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + ((e->state).reg.A & 0xf)))
      ;
      (e->state).reg.A = (e->state).reg.A + (e->state).reg.A;
      break;
    case 0x10ae56:
      bVar4 = (e->state).reg.field_1.field_0.B;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10af2f:
      bVar4 = (e->state).reg.field_1.field_0.C;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b008:
      bVar4 = (e->state).reg.field_2.field_0.D;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b0e1:
      bVar4 = (e->state).reg.field_2.field_0.E;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b1ba:
      bVar4 = (e->state).reg.field_3.field_0.H;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b293:
      bVar4 = (e->state).reg.field_3.field_0.L;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b36c:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b44f:
      bVar4 = (e->state).reg.A;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      break;
    case 0x10b528:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_1.field_0.B);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_1.field_0.B) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_1.field_0.B & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_1.field_0.B;
      break;
    case 0x10b5e9:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_1.field_0.C);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_1.field_0.C) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_1.field_0.C & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_1.field_0.C;
      break;
    case 0x10b6aa:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_2.field_0.D);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_2.field_0.D) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_2.field_0.D & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_2.field_0.D;
      break;
    case 0x10b76b:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_2.field_0.E);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_2.field_0.E) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_2.field_0.E & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_2.field_0.E;
      break;
    case 0x10b82c:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_3.field_0.H);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_3.field_0.H) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_3.field_0.H & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_3.field_0.H;
      break;
    case 0x10b8ed:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_3.field_0.L);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_3.field_0.L) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_3.field_0.L & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.field_3.field_0.L;
      break;
    case 0x10b9ae:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.F.Z = (uint)((e->state).reg.A == bVar4);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)bVar4) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - (bVar4 & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - bVar4;
      break;
    case 0x10ba6a:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.A);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.A) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.A & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - (e->state).reg.A;
      break;
    case 0x10bb2b:
      bVar4 = (e->state).reg.field_1.field_0.B;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10bc02:
      bVar4 = (e->state).reg.field_1.field_0.C;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10bcd9:
      bVar4 = (e->state).reg.field_2.field_0.D;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10bdb0:
      bVar4 = (e->state).reg.field_2.field_0.E;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10be87:
      bVar4 = (e->state).reg.field_3.field_0.H;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10bf5e:
      bVar4 = (e->state).reg.field_3.field_0.L;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10c035:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10c116:
      bVar4 = (e->state).reg.A;
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      break;
    case 0x10c1ed:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_1.field_0.B;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c25a:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_1.field_0.C;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c2c7:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_2.field_0.D;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c334:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_2.field_0.E;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c3a1:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_3.field_0.H;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c40e:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.field_3.field_0.L;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c47b:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = (e->state).reg.A & bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c4f4:
      (e->state).reg.A = (e->state).reg.A & (e->state).reg.A;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c561:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_1.field_0.B;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c5ce:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_1.field_0.C;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c63b:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_2.field_0.D;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c6a8:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_2.field_0.E;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c715:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_3.field_0.H;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c782:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.field_3.field_0.L;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c7ef:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = (e->state).reg.A ^ bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c868:
      (e->state).reg.A = (e->state).reg.A ^ (e->state).reg.A;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c8d5:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_1.field_0.B;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c942:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_1.field_0.C;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10c9af:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_2.field_0.D;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10ca1c:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_2.field_0.E;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10ca89:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_3.field_0.H;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10caf6:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.field_3.field_0.L;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10cb63:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.A = (e->state).reg.A | bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10cbdc:
      (e->state).reg.A = (e->state).reg.A | (e->state).reg.A;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      break;
    case 0x10cc49:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_1.field_0.B);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_1.field_0.B) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_1.field_0.B & 0xf)) < 0);
      break;
    case 0x10ccec:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_1.field_0.C);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_1.field_0.C) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_1.field_0.C & 0xf)) < 0);
      break;
    case 0x10cd8f:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_2.field_0.D);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_2.field_0.D) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_2.field_0.D & 0xf)) < 0);
      break;
    case 0x10ce32:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_2.field_0.E);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_2.field_0.E) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_2.field_0.E & 0xf)) < 0);
      break;
    case 0x10ced5:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_3.field_0.H);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_3.field_0.H) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_3.field_0.H & 0xf)) < 0);
      break;
    case 0x10cf78:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.field_3.field_0.L);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.field_3.field_0.L) < 0);
      (e->state).reg.F.H =
           (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.field_3.field_0.L & 0xf)) < 0);
      break;
    case 0x10d01b:
      bVar4 = read_u8_tick(e,(e->state).reg.field_3.HL);
      (e->state).reg.F.Z = (uint)((e->state).reg.A == bVar4);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)bVar4) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - (bVar4 & 0xf)) < 0);
      break;
    case 0x10d0c0:
      (e->state).reg.F.Z = (uint)((e->state).reg.A == (e->state).reg.A);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)(e->state).reg.A) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - ((e->state).reg.A & 0xf)) < 0);
      break;
    case 0x10d163:
      tick(e);
      if ((e->state).reg.F.Z == FALSE) {
        local_18.HL = read_u16_tick(e,(e->state).reg.SP);
        (e->state).reg.SP = (e->state).reg.SP + 2;
        tick(e);
      }
      break;
    case 0x10d1b4:
      uVar6 = read_u16_tick(e,(e->state).reg.SP);
      (e->state).reg.field_1.BC = uVar6;
      (e->state).reg.SP = (e->state).reg.SP + 2;
      break;
    case 0x10d1f0:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.Z == FALSE) {
        tick(e);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x10d236:
      local_18.HL = read_u16_tick(e,(e->state).reg.PC);
      tick(e);
      break;
    case 0x10d267:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.Z == FALSE) {
        tick(e);
        (e->state).reg.SP = (e->state).reg.SP - 2;
        write_u16_tick(e,(e->state).reg.SP,uVar6 + 3);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x10d2dd:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,(e->state).reg.field_1.BC);
      break;
    case 0x10d322:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4);
      (e->state).reg.F.H = (uint)(0xf < (byte)(((e->state).reg.A & 0xf) + (bVar4 & 0xf)));
      (e->state).reg.A = (e->state).reg.A + bVar4;
      local_18.HL = uVar6 + 2;
      break;
    case 0x10d3eb:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0;
      break;
    case 0x10d42f:
      tick(e);
      if ((e->state).reg.F.Z != FALSE) {
        local_18.HL = read_u16_tick(e,(e->state).reg.SP);
        (e->state).reg.SP = (e->state).reg.SP + 2;
        tick(e);
      }
      break;
    case 0x10d480:
      local_18.HL = read_u16_tick(e,(e->state).reg.SP);
      (e->state).reg.SP = (e->state).reg.SP + 2;
      tick(e);
      break;
    case 0x10d4bb:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.Z != FALSE) {
        tick(e);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x10d501:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (*(code *)(&DAT_00122964 + *(int *)(&DAT_00122964 + (ulong)bVar4 * 4)))();
      return;
    case 0x111ddf:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.Z != FALSE) {
        tick(e);
        (e->state).reg.SP = (e->state).reg.SP - 2;
        write_u16_tick(e,(e->state).reg.SP,uVar6 + 3);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x111e55:
      local_18.HL = read_u16_tick(e,(e->state).reg.PC);
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,uVar6 + 3);
      break;
    case 0x111ebe:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A + bVar4 + (char)BVar8) == '\0');
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(e->state).reg.A + (uint)bVar4 + (BVar8 & 0xff));
      (e->state).reg.F.H = (uint)(0xf < ((e->state).reg.A & 0xf) + (bVar4 & 0xf) + (BVar8 & 0xff));
      (e->state).reg.A = (e->state).reg.A + bVar4 + (char)BVar8;
      local_18.HL = uVar6 + 2;
      break;
    case 0x111fac:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 8;
      break;
    case 0x111ff0:
      tick(e);
      if ((e->state).reg.F.C == FALSE) {
        local_18.HL = read_u16_tick(e,(e->state).reg.SP);
        (e->state).reg.SP = (e->state).reg.SP + 2;
        tick(e);
      }
      break;
    case 0x112041:
      uVar6 = read_u16_tick(e,(e->state).reg.SP);
      (e->state).reg.field_2.DE = uVar6;
      (e->state).reg.SP = (e->state).reg.SP + 2;
      break;
    case 0x11207d:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.C == FALSE) {
        tick(e);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x1120c3:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.C == FALSE) {
        tick(e);
        (e->state).reg.SP = (e->state).reg.SP - 2;
        write_u16_tick(e,(e->state).reg.SP,uVar6 + 3);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x112139:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,(e->state).reg.field_2.DE);
      break;
    case 0x11217e:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.F.Z = (uint)((e->state).reg.A == bVar4);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)bVar4) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - (bVar4 & 0xf)) < 0);
      (e->state).reg.A = (e->state).reg.A - bVar4;
      local_18.HL = uVar6 + 2;
      break;
    case 0x112245:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x10;
      break;
    case 0x112289:
      tick(e);
      if ((e->state).reg.F.C != FALSE) {
        local_18.HL = read_u16_tick(e,(e->state).reg.SP);
        (e->state).reg.SP = (e->state).reg.SP + 2;
        tick(e);
      }
      break;
    case 0x1122da:
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      (e->state).interrupt.ime = TRUE;
      local_18.HL = read_u16_tick(e,(e->state).reg.SP);
      (e->state).reg.SP = (e->state).reg.SP + 2;
      tick(e);
      break;
    case 0x112331:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.C != FALSE) {
        tick(e);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x112377:
      aVar5.HL = read_u16_tick(e,(e->state).reg.PC);
      local_18.HL = uVar6 + 3;
      if ((e->state).reg.F.C != FALSE) {
        tick(e);
        (e->state).reg.SP = (e->state).reg.SP - 2;
        write_u16_tick(e,(e->state).reg.SP,uVar6 + 3);
        local_18.HL = aVar5.HL;
      }
      break;
    case 0x1123ed:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      BVar8 = (e->state).reg.F.C;
      (e->state).reg.F.Z = (uint)((byte)((e->state).reg.A - bVar4) == (char)BVar8);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C =
           (uint)((int)(((uint)(e->state).reg.A - (uint)bVar4) - (BVar8 & 0xff)) < 0);
      (e->state).reg.F.H =
           (uint)((int)((((e->state).reg.A & 0xf) - (bVar4 & 0xf)) - (BVar8 & 0xff)) < 0);
      (e->state).reg.A = (e->state).reg.A - (bVar4 + (char)BVar8);
      local_18.HL = uVar6 + 2;
      break;
    case 0x1124d9:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x18;
      break;
    case 0x11251d:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      write_u8_tick(e,bVar4 - 0x100,(e->state).reg.A);
      local_18.HL = uVar6 + 2;
      break;
    case 0x11256b:
      uVar6 = read_u16_tick(e,(e->state).reg.SP);
      (e->state).reg.field_3.HL = uVar6;
      (e->state).reg.SP = (e->state).reg.SP + 2;
      break;
    case 0x1125a7:
      write_u8_tick(e,(e->state).reg.field_1.field_0.C - 0x100,(e->state).reg.A);
      break;
    case 0x1125d6:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,(e->state).reg.field_3.HL);
      break;
    case 0x11261b:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.A = (e->state).reg.A & bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.H = TRUE;
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.N = FALSE;
      local_18.HL = uVar6 + 2;
      break;
    case 0x11269f:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x20;
      break;
    case 0x1126e3:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(byte)(e->state).reg.SP + (uint)bVar4);
      (e->state).reg.F.H = (uint)(0xf < (byte)(((byte)(e->state).reg.SP & 0xf) + (bVar4 & 0xf)));
      (e->state).reg.SP = (e->state).reg.SP + (short)(char)bVar4;
      tick(e);
      tick(e);
      local_18.HL = uVar6 + 2;
      break;
    case 0x1127aa:
      local_18 = (e->state).reg.field_3;
      break;
    case 0x1127be:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      write_u8_tick(e,uVar7,(e->state).reg.A);
      local_18.HL = uVar6 + 3;
      break;
    case 0x112804:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.A = (e->state).reg.A ^ bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      local_18.HL = uVar6 + 2;
      break;
    case 0x112888:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x28;
      break;
    case 0x1128cc:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      uVar3 = read_u8_tick(e,bVar4 - 0x100);
      (e->state).reg.A = uVar3;
      local_18.HL = uVar6 + 2;
      break;
    case 0x112918:
      uVar6 = read_u16_tick(e,(e->state).reg.SP);
      set_af_reg(e,uVar6);
      (e->state).reg.SP = (e->state).reg.SP + 2;
      break;
    case 0x11295a:
      uVar3 = read_u8_tick(e,(e->state).reg.field_1.field_0.C - 0x100);
      (e->state).reg.A = uVar3;
      break;
    case 0x112987:
      (e->state).interrupt.state = CPU_STATE_NORMAL;
      (e->state).interrupt.ime = FALSE;
      break;
    case 0x1129a8:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      AVar1 = (e->state).reg.SP;
      uVar6 = get_af_reg(e);
      write_u16_tick(e,AVar1,uVar6);
      break;
    case 0x1129fe:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.A = (e->state).reg.A | bVar4;
      (e->state).reg.F.Z = (uint)((e->state).reg.A == '\0');
      (e->state).reg.F.C = FALSE;
      (e->state).reg.F.H = FALSE;
      (e->state).reg.F.N = FALSE;
      local_18.HL = uVar6 + 2;
      break;
    case 0x112a82:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x30;
      break;
    case 0x112ac6:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.F.N = FALSE;
      (e->state).reg.F.Z = FALSE;
      (e->state).reg.F.C = (uint)(0xff < (uint)(byte)(e->state).reg.SP + (uint)bVar4);
      (e->state).reg.F.H = (uint)(0xf < (byte)(((byte)(e->state).reg.SP & 0xf) + (bVar4 & 0xf)));
      (e->state).reg.field_3.HL = (e->state).reg.SP + (short)(char)bVar4;
      tick(e);
      local_18.HL = uVar6 + 2;
      break;
    case 0x112b8b:
      (e->state).reg.SP = (u16)(e->state).reg.field_3;
      tick(e);
      break;
    case 0x112baf:
      uVar7 = read_u16_tick(e,(e->state).reg.PC);
      uVar3 = read_u8_tick(e,uVar7);
      (e->state).reg.A = uVar3;
      local_18.HL = uVar6 + 3;
      break;
    case 0x112bf3:
      (e->state).interrupt.state = CPU_STATE_ENABLE_IME;
      break;
    case 0x112c06:
      bVar4 = read_u8_tick(e,(e->state).reg.PC);
      (e->state).reg.F.Z = (uint)((e->state).reg.A == bVar4);
      (e->state).reg.F.N = TRUE;
      (e->state).reg.F.C = (uint)((int)((uint)(e->state).reg.A - (uint)bVar4) < 0);
      (e->state).reg.F.H = (uint)((int)(((e->state).reg.A & 0xf) - (bVar4 & 0xf)) < 0);
      local_18.HL = uVar6 + 2;
      break;
    case 0x112cb3:
      tick(e);
      (e->state).reg.SP = (e->state).reg.SP - 2;
      write_u16_tick(e,(e->state).reg.SP,local_18.HL);
      local_18.HL = 0x38;
      break;
    case 0x112cf4:
      (e->state).event = (e->state).event | 0x10;
    }
    (e->state).reg.PC = (u16)local_18;
  }
  return;
}

Assistant:

static void execute_instruction(Emulator* e) {
  u8 opcode = 0;
  s8 s;
  u8 u, c;
  u16 u16;
  Address new_pc;

  if (UNLIKELY(TICKS >= e->state.next_intr_ticks)) {
    if (TICKS >= TIMER.next_intr_ticks) {
      timer_synchronize(e);
    }
    if (TICKS >= SERIAL.next_intr_ticks) {
      serial_synchronize(e);
    }
    if (TICKS >= PPU.next_intr_ticks) {
      ppu_synchronize(e);
    }
  }

  Bool should_dispatch = FALSE;

  if (LIKELY(INTR.state == CPU_STATE_NORMAL)) {
    should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
    opcode = read_u8_tick(e, REG.PC);
  } else {
    switch (INTR.state) {
      case CPU_STATE_NORMAL:
        assert(0);

      case CPU_STATE_STOP:
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        if (UNLIKELY(!should_dispatch)) {
          // TODO(binji): proper timing of speed switching.
          if (CPU_SPEED.switching) {
            intr_synchronize(e);
            CPU_SPEED.switching = FALSE;
            CPU_SPEED.speed ^= 1;
            INTR.state = CPU_STATE_NORMAL;
            if (CPU_SPEED.speed == SPEED_NORMAL) {
              e->state.cpu_tick = CPU_TICK;
              HOOK(speed_switch_i, 1);
            } else {
              e->state.cpu_tick = CPU_2X_TICK;
              HOOK(speed_switch_i, 2);
            }
          } else {
            TICKS += CPU_TICK;
            return;
          }
        }
        opcode = read_u8_tick(e, REG.PC);
        break;

      case CPU_STATE_ENABLE_IME:
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        INTR.ime = TRUE;
        INTR.state = CPU_STATE_NORMAL;
        opcode = read_u8_tick(e, REG.PC);
        break;

      case CPU_STATE_HALT_BUG:
        /* When interrupts are disabled during a HALT, the following byte will
         * be duplicated when decoding. */
        should_dispatch = INTR.ime && (INTR.new_if & INTR.ie) != 0;
        opcode = read_u8(e, REG.PC);
        REG.PC--;
        INTR.state = CPU_STATE_NORMAL;
        break;

      case CPU_STATE_HALT:
        should_dispatch = (INTR.new_if & INTR.ie) != 0;
        tick(e);
        if (UNLIKELY(should_dispatch)) {
          intr_synchronize(e);
          dispatch_interrupt(e);
        }
        return;

      case CPU_STATE_HALT_DI:
        should_dispatch = (INTR.new_if & INTR.ie) != 0;
        opcode = read_u8_tick(e, REG.PC);
        if (UNLIKELY(should_dispatch)) {
          HOOK0(interrupt_during_halt_di_v);
          INTR.state = CPU_STATE_NORMAL;
          should_dispatch = FALSE;
          break;
        }
        return;
    }
  }

  if (UNLIKELY(should_dispatch)) {
    intr_synchronize(e);
    dispatch_interrupt(e);
    return;
  }

#define REG_OPS(code, name)            \
  case code + 0: name##_R(B); break;   \
  case code + 1: name##_R(C); break;   \
  case code + 2: name##_R(D); break;   \
  case code + 3: name##_R(E); break;   \
  case code + 4: name##_R(H); break;   \
  case code + 5: name##_R(L); break;   \
  case code + 6: name##_MR(HL); break; \
  case code + 7: name##_R(A); break;
#define REG_OPS_N(code, name, N)          \
  case code + 0: name##_R(N, B); break;   \
  case code + 1: name##_R(N, C); break;   \
  case code + 2: name##_R(N, D); break;   \
  case code + 3: name##_R(N, E); break;   \
  case code + 4: name##_R(N, H); break;   \
  case code + 5: name##_R(N, L); break;   \
  case code + 6: name##_MR(N, HL); break; \
  case code + 7: name##_R(N, A); break;
#define LD_R_OPS(code, R) REG_OPS_N(code, LD_R, R)

  HOOK(exec_op_ai, REG.PC, opcode);
  new_pc = ++REG.PC;

  switch (opcode) {
    case 0x00: break;
    case 0x01: LD_RR_NN(BC); break;
    case 0x02: LD_MR_R(BC, A); break;
    case 0x03: INC_RR(BC); break;
    case 0x04: INC_R(B); break;
    case 0x05: DEC_R(B); break;
    case 0x06: LD_R_N(B); break;
    case 0x07: RLCA; break;
    case 0x08: LD_MNN_SP; break;
    case 0x09: ADD_HL_RR(BC); break;
    case 0x0a: LD_R_MR(A, BC); break;
    case 0x0b: DEC_RR(BC); break;
    case 0x0c: INC_R(C); break;
    case 0x0d: DEC_R(C); break;
    case 0x0e: LD_R_N(C); break;
    case 0x0f: RRCA; break;
    case 0x10: STOP; break;
    case 0x11: LD_RR_NN(DE); break;
    case 0x12: LD_MR_R(DE, A); break;
    case 0x13: INC_RR(DE); break;
    case 0x14: INC_R(D); break;
    case 0x15: DEC_R(D); break;
    case 0x16: LD_R_N(D); break;
    case 0x17: RLA; break;
    case 0x18: JR_N; break;
    case 0x19: ADD_HL_RR(DE); break;
    case 0x1a: LD_R_MR(A, DE); break;
    case 0x1b: DEC_RR(DE); break;
    case 0x1c: INC_R(E); break;
    case 0x1d: DEC_R(E); break;
    case 0x1e: LD_R_N(E); break;
    case 0x1f: RRA; break;
    case 0x20: JR_F_N(!FZ); break;
    case 0x21: LD_RR_NN(HL); break;
    case 0x22: LD_MR_R(HL, A); REG.HL++; break;
    case 0x23: INC_RR(HL); break;
    case 0x24: INC_R(H); break;
    case 0x25: DEC_R(H); break;
    case 0x26: LD_R_N(H); break;
    case 0x27: DAA; break;
    case 0x28: JR_F_N(FZ); break;
    case 0x29: ADD_HL_RR(HL); break;
    case 0x2a: LD_R_MR(A, HL); REG.HL++; break;
    case 0x2b: DEC_RR(HL); break;
    case 0x2c: INC_R(L); break;
    case 0x2d: DEC_R(L); break;
    case 0x2e: LD_R_N(L); break;
    case 0x2f: CPL; break;
    case 0x30: JR_F_N(!FC); break;
    case 0x31: LD_RR_NN(SP); break;
    case 0x32: LD_MR_R(HL, A); REG.HL--; break;
    case 0x33: INC_RR(SP); break;
    case 0x34: INC_MR(HL); break;
    case 0x35: DEC_MR(HL); break;
    case 0x36: LD_MR_N(HL); break;
    case 0x37: SCF; break;
    case 0x38: JR_F_N(FC); break;
    case 0x39: ADD_HL_RR(SP); break;
    case 0x3a: LD_R_MR(A, HL); REG.HL--; break;
    case 0x3b: DEC_RR(SP); break;
    case 0x3c: INC_R(A); break;
    case 0x3d: DEC_R(A); break;
    case 0x3e: LD_R_N(A); break;
    case 0x3f: CCF; break;
    LD_R_OPS(0x40, B)
    LD_R_OPS(0x48, C)
    LD_R_OPS(0x50, D)
    LD_R_OPS(0x58, E)
    LD_R_OPS(0x60, H)
    LD_R_OPS(0x68, L)
    case 0x70: LD_MR_R(HL, B); break;
    case 0x71: LD_MR_R(HL, C); break;
    case 0x72: LD_MR_R(HL, D); break;
    case 0x73: LD_MR_R(HL, E); break;
    case 0x74: LD_MR_R(HL, H); break;
    case 0x75: LD_MR_R(HL, L); break;
    case 0x76: HALT; break;
    case 0x77: LD_MR_R(HL, A); break;
    LD_R_OPS(0x78, A)
    REG_OPS(0x80, ADD)
    REG_OPS(0x88, ADC)
    REG_OPS(0x90, SUB)
    REG_OPS(0x98, SBC)
    REG_OPS(0xa0, AND)
    REG_OPS(0xa8, XOR)
    REG_OPS(0xb0, OR)
    REG_OPS(0xb8, CP)
    case 0xc0: RET_F(!FZ); break;
    case 0xc1: POP_RR(BC); break;
    case 0xc2: JP_F_NN(!FZ); break;
    case 0xc3: JP_NN; break;
    case 0xc4: CALL_F_NN(!FZ); break;
    case 0xc5: PUSH_RR(BC); break;
    case 0xc6: ADD_N; break;
    case 0xc7: CALL(0x00); break;
    case 0xc8: RET_F(FZ); break;
    case 0xc9: RET; break;
    case 0xca: JP_F_NN(FZ); break;
    case 0xcb: {
      new_pc += 1;
      u8 cb = read_u8_tick(e, REG.PC);
      HOOK(exec_cb_op_i, cb);
      switch (cb) {
        REG_OPS(0x00, RLC)
        REG_OPS(0x08, RRC)
        REG_OPS(0x10, RL)
        REG_OPS(0x18, RR)
        REG_OPS(0x20, SLA)
        REG_OPS(0x28, SRA)
        REG_OPS(0x30, SWAP)
        REG_OPS(0x38, SRL)
        REG_OPS_N(0x40, BIT, 0)
        REG_OPS_N(0x48, BIT, 1)
        REG_OPS_N(0x50, BIT, 2)
        REG_OPS_N(0x58, BIT, 3)
        REG_OPS_N(0x60, BIT, 4)
        REG_OPS_N(0x68, BIT, 5)
        REG_OPS_N(0x70, BIT, 6)
        REG_OPS_N(0x78, BIT, 7)
        REG_OPS_N(0x80, RES, 0)
        REG_OPS_N(0x88, RES, 1)
        REG_OPS_N(0x90, RES, 2)
        REG_OPS_N(0x98, RES, 3)
        REG_OPS_N(0xa0, RES, 4)
        REG_OPS_N(0xa8, RES, 5)
        REG_OPS_N(0xb0, RES, 6)
        REG_OPS_N(0xb8, RES, 7)
        REG_OPS_N(0xc0, SET, 0)
        REG_OPS_N(0xc8, SET, 1)
        REG_OPS_N(0xd0, SET, 2)
        REG_OPS_N(0xd8, SET, 3)
        REG_OPS_N(0xe0, SET, 4)
        REG_OPS_N(0xe8, SET, 5)
        REG_OPS_N(0xf0, SET, 6)
        REG_OPS_N(0xf8, SET, 7)
      }
      break;
    }
    case 0xcc: CALL_F_NN(FZ); break;
    case 0xcd: CALL_NN; break;
    case 0xce: ADC_N; break;
    case 0xcf: CALL(0x08); break;
    case 0xd0: RET_F(!FC); break;
    case 0xd1: POP_RR(DE); break;
    case 0xd2: JP_F_NN(!FC); break;
    case 0xd4: CALL_F_NN(!FC); break;
    case 0xd5: PUSH_RR(DE); break;
    case 0xd6: SUB_N; break;
    case 0xd7: CALL(0x10); break;
    case 0xd8: RET_F(FC); break;
    case 0xd9: RETI; break;
    case 0xda: JP_F_NN(FC); break;
    case 0xdc: CALL_F_NN(FC); break;
    case 0xde: SBC_N; break;
    case 0xdf: CALL(0x18); break;
    case 0xe0: LD_MFF00_N_R(A); break;
    case 0xe1: POP_RR(HL); break;
    case 0xe2: LD_MFF00_R_R(C, A); break;
    case 0xe5: PUSH_RR(HL); break;
    case 0xe6: AND_N; break;
    case 0xe7: CALL(0x20); break;
    case 0xe8: ADD_SP_N; break;
    case 0xe9: JP_RR(HL); break;
    case 0xea: LD_MN_R(A); break;
    case 0xee: XOR_N; break;
    case 0xef: CALL(0x28); break;
    case 0xf0: LD_R_MFF00_N(A); break;
    case 0xf1: POP_AF; break;
    case 0xf2: LD_R_MFF00_R(A, C); break;
    case 0xf3: DI; break;
    case 0xf5: PUSH_AF; break;
    case 0xf6: OR_N; break;
    case 0xf7: CALL(0x30); break;
    case 0xf8: LD_HL_SP_N; break;
    case 0xf9: LD_RR_RR(SP, HL); break;
    case 0xfa: LD_R_MN(A); break;
    case 0xfb: EI; break;
    case 0xfe: CP_N; break;
    case 0xff: CALL(0x38); break;
    default:
      e->state.event |= EMULATOR_EVENT_INVALID_OPCODE;
      break;
  }
  REG.PC = new_pc;
}